

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

opj_tcd_t * tcd_create(opj_common_ptr cinfo)

{
  opj_tcd_t *__ptr;
  opj_tcd_image_t *poVar1;
  
  __ptr = (opj_tcd_t *)malloc(0x58);
  if (__ptr != (opj_tcd_t *)0x0) {
    __ptr->cinfo = cinfo;
    poVar1 = (opj_tcd_image_t *)malloc(0x10);
    __ptr->tcd_image = poVar1;
    if (poVar1 != (opj_tcd_image_t *)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (opj_tcd_t *)0x0;
}

Assistant:

opj_tcd_t* tcd_create(opj_common_ptr cinfo) {
	/* create the tcd structure */
	opj_tcd_t *tcd = (opj_tcd_t*)opj_malloc(sizeof(opj_tcd_t));
	if(!tcd) return NULL;
	tcd->cinfo = cinfo;
	tcd->tcd_image = (opj_tcd_image_t*)opj_malloc(sizeof(opj_tcd_image_t));
	if(!tcd->tcd_image) {
		opj_free(tcd);
		return NULL;
	}

	return tcd;
}